

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

Estimate<double> *
Catch::Benchmark::Detail::bootstrap
          (Estimate<double> *__return_storage_ptr__,double confidence_level,double *first,
          double *last,sample *resample,_func_double_double_ptr_double_ptr *estimator)

{
  double dVar1;
  double *pdVar2;
  sample *psVar3;
  iterator __begin2;
  pointer pdVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  sample jack;
  vector<double,_std::allocator<double>_> local_98;
  double local_78;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double local_50;
  sample *local_48;
  Estimate<double> *local_40;
  double local_38;
  
  local_70 = (*estimator)(first,last);
  if ((long)last - (long)first == 8) {
    __return_storage_ptr__->point = local_70;
    __return_storage_ptr__->lower_bound = local_70;
    __return_storage_ptr__->upper_bound = local_70;
    __return_storage_ptr__->confidence_interval = confidence_level;
  }
  else {
    local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_48 = resample;
    local_40 = __return_storage_ptr__;
    std::vector<double,_std::allocator<double>_>::reserve(&local_98,(long)last - (long)first >> 3);
    if (first != last) {
      pdVar5 = first;
      do {
        dVar1 = *pdVar5;
        *pdVar5 = *first;
        *first = dVar1;
        local_38 = (*estimator)(first + 1,last);
        if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_98,
                     (iterator)
                     local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_38);
        }
        else {
          *local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_38;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        pdVar5 = pdVar5 + 1;
      } while (pdVar5 != last);
    }
    __return_storage_ptr__ = local_40;
    psVar3 = local_48;
    local_68 = 0.0;
    dVar1 = 0.0;
    if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      dVar9 = 0.0;
      pdVar4 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        dVar9 = dVar9 + *pdVar4;
        pdVar4 = pdVar4 + 1;
      } while (pdVar4 != local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      if ((long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start == 0) {
        local_68 = 0.0;
        dVar1 = 0.0;
      }
      else {
        dVar1 = 0.0;
        local_68 = 0.0;
        pdVar4 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          dVar11 = dVar9 / (double)((long)local_98.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_98.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 3) - *pdVar4;
          local_68 = local_68 + dVar11 * dVar11 * dVar11;
          dVar1 = dVar1 + dVar11 * dVar11;
          pdVar4 = pdVar4 + 1;
        } while (pdVar4 != local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
    }
    uStack_60 = 0;
    dVar1 = pow(dVar1,1.5);
    pdVar5 = (psVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (psVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    lVar8 = (long)pdVar2 - (long)pdVar5 >> 3;
    dVar9 = 0.0;
    if (pdVar2 != pdVar5) {
      lVar7 = 0;
      do {
        lVar7 = lVar7 + (ulong)(*pdVar5 <= local_70 && local_70 != *pdVar5);
        pdVar5 = pdVar5 + 1;
      } while (pdVar5 != pdVar2);
      dVar9 = (double)lVar7;
    }
    dVar11 = (double)lVar8;
    dVar9 = dVar9 / dVar11;
    if ((dVar9 != 0.0) || (dVar10 = local_70, dVar12 = local_70, NAN(dVar9))) {
      local_50 = dVar1 * 6.0;
      local_78 = dVar11;
      local_58 = normal_quantile(dVar9);
      dVar1 = normal_quantile((1.0 - confidence_level) * 0.5);
      dVar9 = -local_68;
      local_68 = (local_58 - dVar1) / ((dVar9 / local_50) * (local_58 - dVar1) + 1.0) + local_58;
      dVar1 = erfc(((local_58 + dVar1) / ((dVar9 / local_50) * (local_58 + dVar1) + 1.0) + local_58)
                   / -1.4142135623730951);
      lVar6 = lround(dVar1 * 0.5 * local_78);
      lVar7 = 0;
      if (0 < lVar6) {
        lVar7 = lVar6;
      }
      dVar1 = erfc(local_68 / -1.4142135623730951);
      lVar6 = lround(dVar1 * 0.5 * local_78);
      lVar8 = lVar8 + -1;
      if (lVar6 <= lVar8) {
        lVar8 = lVar6;
      }
      pdVar4 = (psVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar12 = pdVar4[lVar7];
      dVar10 = pdVar4[lVar8];
    }
    __return_storage_ptr__->point = local_70;
    __return_storage_ptr__->lower_bound = dVar12;
    __return_storage_ptr__->upper_bound = dVar10;
    __return_storage_ptr__->confidence_interval = confidence_level;
    if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Estimate<double>
            bootstrap( double confidence_level,
                       double* first,
                       double* last,
                       sample const& resample,
                       double ( *estimator )( double const*, double const* ) ) {
                auto n_samples = last - first;

                double point = estimator( first, last );
                // Degenerate case with a single sample
                if ( n_samples == 1 )
                    return { point, point, point, confidence_level };

                sample jack = jackknife( estimator, first, last );
                double jack_mean =
                    mean( jack.data(), jack.data() + jack.size() );
                double sum_squares = 0, sum_cubes = 0;
                for ( double x : jack ) {
                    auto difference = jack_mean - x;
                    auto square = difference * difference;
                    auto cube = square * difference;
                    sum_squares += square;
                    sum_cubes += cube;
                }

                double accel = sum_cubes / ( 6 * std::pow( sum_squares, 1.5 ) );
                long n = static_cast<long>( resample.size() );
                double prob_n =
                    std::count_if( resample.begin(),
                                   resample.end(),
                                   [point]( double x ) { return x < point; } ) /
                    static_cast<double>( n );
                // degenerate case with uniform samples
                if ( Catch::Detail::directCompare( prob_n, 0. ) ) {
                    return { point, point, point, confidence_level };
                }

                double bias = normal_quantile( prob_n );
                double z1 = normal_quantile( ( 1. - confidence_level ) / 2. );

                auto cumn = [n]( double x ) -> long {
                    return std::lround( normal_cdf( x ) *
                                        static_cast<double>( n ) );
                };
                auto a = [bias, accel]( double b ) {
                    return bias + b / ( 1. - accel * b );
                };
                double b1 = bias + z1;
                double b2 = bias - z1;
                double a1 = a( b1 );
                double a2 = a( b2 );
                auto lo = static_cast<size_t>( (std::max)( cumn( a1 ), 0l ) );
                auto hi =
                    static_cast<size_t>( (std::min)( cumn( a2 ), n - 1 ) );

                return { point, resample[lo], resample[hi], confidence_level };
            }